

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_form_insert_tet
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  uint uVar6;
  int iVar7;
  REF_STATUS RVar8;
  int iVar9;
  long lVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT face_nodes [3];
  int local_4c;
  int local_48;
  int local_44 [3];
  long local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar1 = ref_node->ref_mpi->id;
  if ((iVar1 == ref_node->part[node]) && (iVar1 == ref_node->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      if (-1 < site) {
        ref_cell = ref_grid->cell[8];
        pRVar2 = ref_cell->ref_adj;
        if ((site < pRVar2->nnode) && (lVar10 = (long)pRVar2->first[site], lVar10 != -1)) {
          pRVar5 = pRVar2->item + lVar10;
          local_38 = lVar10;
          do {
            iVar1 = pRVar5->ref;
            iVar7 = ref_cell->node_per;
            if (iVar7 < 1) {
LAB_0015f739:
              uVar6 = ref_list_contains(ref_cavity->tet_list,iVar1,&local_48);
              if (uVar6 == 0) {
                if (local_48 != 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x4eb,"ref_cavity_form_insert_tet","added tet twice?");
                  return 1;
                }
                uVar6 = ref_list_push(ref_cavity->tet_list,iVar1);
                if (uVar6 == 0) {
                  uVar6 = ref_cell_all_local(ref_cell,ref_node,iVar1,&local_4c);
                  if (uVar6 == 0) {
                    if (local_4c != 0) {
                      iVar7 = ref_cell->face_per;
                      if (0 < iVar7) {
                        lVar10 = 0;
                        lVar16 = 0;
                        do {
                          pRVar3 = ref_cell->c2n;
                          iVar9 = ref_cell->size_per;
                          pRVar4 = ref_cell->f2n;
                          lVar13 = 0;
                          do {
                            local_44[lVar13] =
                                 pRVar3[(long)*(int *)((long)pRVar4 + lVar13 * 4 + lVar10) +
                                        (long)iVar9 * (long)iVar1];
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != 3);
                          if (((local_44[0] != node) && (local_44[1] != node)) &&
                             (local_44[2] != node)) {
                            uVar6 = ref_cavity_insert_face(ref_cavity,local_44);
                            if (uVar6 != 0) {
                              pcVar15 = "tet side";
                              uVar11 = 0x4fa;
                              goto LAB_0015f918;
                            }
                            iVar7 = ref_cell->face_per;
                          }
                          lVar16 = lVar16 + 1;
                          lVar10 = lVar10 + 0x10;
                        } while (lVar16 < iVar7);
                      }
                      goto LAB_0015f836;
                    }
                    goto LAB_0015f85f;
                  }
                  pcVar15 = "local cell";
                  uVar11 = 0x4ed;
                }
                else {
                  pcVar15 = "save tet";
                  uVar11 = 0x4ec;
                }
              }
              else {
                pcVar15 = "have tet?";
                uVar11 = 0x4ea;
              }
LAB_0015f918:
              uVar14 = (ulong)uVar6;
              goto LAB_0015f8e8;
            }
            bVar17 = false;
            iVar9 = 0;
            do {
              while (!bVar17) {
                iVar12 = ref_cell->size_per * iVar1 + iVar9;
                bVar17 = ref_cell->c2n[iVar12] == protect;
                iVar9 = iVar9 + 1;
                if (iVar9 == iVar7) {
                  if (ref_cell->c2n[iVar12] != protect) goto LAB_0015f739;
                  goto LAB_0015f836;
                }
              }
              iVar9 = iVar9 + 1;
              bVar17 = true;
            } while (iVar9 != iVar7);
LAB_0015f836:
            pRVar5 = ref_cell->ref_adj->item;
            lVar10 = (long)pRVar5[(int)local_38].next;
            if (lVar10 == -1) break;
            pRVar5 = pRVar5 + lVar10;
            local_38 = lVar10;
          } while( true );
        }
      }
      RVar8 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar8 == 0) {
        RVar8 = ref_cavity_verify_seg_manifold(ref_cavity);
        if (RVar8 == 0) {
          return 0;
        }
        pcVar15 = "ball seg manifold";
        uVar11 = 0x500;
      }
      else {
        pcVar15 = "ball face manifold";
        uVar11 = 0x4ff;
      }
      uVar6 = 1;
      uVar14 = 1;
LAB_0015f8e8:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar11,"ref_cavity_form_insert_tet",uVar14,pcVar15);
      return uVar6;
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
LAB_0015f85f:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert_tet(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node,
                                              REF_INT site, REF_INT protect) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}